

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mpi_write_hlp(mbedtls_mpi *X,int radix,char **p)

{
  byte *pbVar1;
  int iVar2;
  byte bVar3;
  mbedtls_mpi_uint r;
  mbedtls_mpi_uint p_1 [1];
  mbedtls_mpi _B;
  ulong local_50;
  mbedtls_mpi_uint local_48;
  mbedtls_mpi local_40;
  
  iVar2 = mbedtls_mpi_mod_int(&local_50,X,(ulong)(uint)radix);
  if (iVar2 == 0) {
    local_40.s = 1;
    local_40.n = 1;
    local_48 = (ulong)(uint)radix;
    local_40.p = &local_48;
    iVar2 = mbedtls_mpi_div_mpi(X,(mbedtls_mpi *)0x0,X,&local_40);
    if (iVar2 == 0) {
      local_48 = 0;
      local_40.s = 1;
      local_40.n = 1;
      local_40.p = &local_48;
      iVar2 = mbedtls_mpi_cmp_mpi(X,&local_40);
      if ((iVar2 != 0) && (iVar2 = mpi_write_hlp(X,radix,p), iVar2 != 0)) {
        return iVar2;
      }
      pbVar1 = (byte *)*p;
      *p = (char *)(pbVar1 + 1);
      bVar3 = (byte)local_50 + 0x37;
      if (local_50 < 10) {
        bVar3 = (byte)local_50 | 0x30;
      }
      *pbVar1 = bVar3;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int mpi_write_hlp( mbedtls_mpi *X, int radix, char **p )
{
    int ret;
    mbedtls_mpi_uint r;

    if( radix < 2 || radix > 16 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, radix ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_div_int( X, NULL, X, radix ) );

    if( mbedtls_mpi_cmp_int( X, 0 ) != 0 )
        MBEDTLS_MPI_CHK( mpi_write_hlp( X, radix, p ) );

    if( r < 10 )
        *(*p)++ = (char)( r + 0x30 );
    else
        *(*p)++ = (char)( r + 0x37 );

cleanup:

    return( ret );
}